

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O3

double __thiscall
HighsLinearSumBounds::getResidualSumUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  double dVar1;
  int iVar2;
  pointer pHVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  
  iVar2 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[sum];
  if (iVar2 == 1) {
    if (coefficient <= 0.0) {
      if (this->implVarLowerSource[var] == sum) {
        dVar5 = this->varLower[var];
      }
      else {
        dVar5 = this->varLower[var];
        if (this->varLower[var] <= this->implVarLower[var]) {
          dVar5 = this->implVarLower[var];
        }
      }
      if (-INFINITY < dVar5) {
        return INFINITY;
      }
    }
    else {
      if (this->implVarUpperSource[var] == sum) {
        dVar5 = this->varUpper[var];
      }
      else {
        dVar5 = this->varUpper[var];
        if (this->implVarUpper[var] <= this->varUpper[var]) {
          dVar5 = this->implVarUpper[var];
        }
      }
      if (dVar5 < INFINITY) {
        return INFINITY;
      }
    }
    pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    return pHVar3[sum].hi + pHVar3[sum].lo;
  }
  if (iVar2 != 0) {
    return INFINITY;
  }
  if (coefficient <= 0.0) {
    if (this->implVarLowerSource[var] != sum) {
      dVar5 = this->varLower[var];
      if (this->varLower[var] <= this->implVarLower[var]) {
        dVar5 = this->implVarLower[var];
      }
      goto LAB_003780e5;
    }
    pdVar4 = this->varLower;
  }
  else {
    if (this->implVarUpperSource[var] != sum) {
      dVar5 = this->varUpper[var];
      if (this->implVarUpper[var] <= this->varUpper[var]) {
        dVar5 = this->implVarUpper[var];
      }
      goto LAB_003780e5;
    }
    pdVar4 = this->varUpper;
  }
  dVar5 = pdVar4[var];
LAB_003780e5:
  pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pHVar3[sum].hi;
  dVar6 = dVar1 - dVar5 * coefficient;
  return (-(dVar5 * coefficient) - (dVar6 - dVar1)) + (dVar1 - (dVar6 - (dVar6 - dVar1))) +
         pHVar3[sum].lo + dVar6;
}

Assistant:

double HighsLinearSumBounds::getResidualSumUpper(HighsInt sum, HighsInt var,
                                                 double coefficient) const {
  switch (numInfSumUpper[sum]) {
    case 0:
      if (coefficient > 0) {
        double vUpper = implVarUpperSource[var] == sum
                            ? varUpper[var]
                            : std::min(implVarUpper[var], varUpper[var]);
        return double(sumUpper[sum] - vUpper * coefficient);
      } else {
        double vLower = implVarLowerSource[var] == sum
                            ? varLower[var]
                            : std::max(implVarLower[var], varLower[var]);
        return double(sumUpper[sum] - vLower * coefficient);
      }
      break;
    case 1:
      if (coefficient > 0) {
        double vUpper = implVarUpperSource[var] == sum
                            ? varUpper[var]
                            : std::min(implVarUpper[var], varUpper[var]);
        return vUpper == kHighsInf ? double(sumUpper[sum]) : kHighsInf;
      } else {
        double vLower = implVarLowerSource[var] == sum
                            ? varLower[var]
                            : std::max(implVarLower[var], varLower[var]);
        return vLower == -kHighsInf ? double(sumUpper[sum]) : kHighsInf;
      }
      break;
    default:
      return kHighsInf;
  }
}